

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O2

void duckdb::Node48::Free(ART *art,Node *node)

{
  Node48 *pNVar1;
  idx_t i;
  long lVar2;
  
  pNVar1 = Node::Ref<duckdb::Node48>(art,(Node)(node->super_IndexPointer).data,NODE_48);
  if (pNVar1->count != '\0') {
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      if ((ulong)pNVar1->child_index[lVar2] != 0x30) {
        Node::Free(art,pNVar1->children + pNVar1->child_index[lVar2]);
      }
    }
  }
  return;
}

Assistant:

void Node48::Free(ART &art, Node &node) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);
	if (!n48.count) {
		return;
	}

	Iterator(n48, [&](Node &child) { Node::Free(art, child); });
}